

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O2

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromId
          (UniqueId *__return_storage_ptr__,IFilePartLoader *this,ParserChar *colladaId,
          ClassId classId)

{
  ObjectId OVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  UniqueId *pUVar4;
  allocator<char> local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  URI uri;
  
  if ((colladaId == (ParserChar *)0x0) || (*colladaId == '\0')) {
    createUniqueId(__return_storage_ptr__,this,classId);
  }
  else {
    iVar3 = (*(this->super_ExtraDataLoader)._vptr_ExtraDataLoader[0xb])(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"#",&local_171);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,colladaId,&local_172);
    std::operator+(&local_130,&local_150,&local_170);
    COLLADABU::URI::URI(&uri,(URI *)CONCAT44(extraout_var,iVar3),&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    pUVar4 = createUniqueIdFromUrl(this,&uri,classId,true);
    __return_storage_ptr__->mFileId = pUVar4->mFileId;
    uVar2 = *(undefined4 *)&pUVar4->field_0x4;
    OVar1 = pUVar4->mObjectId;
    __return_storage_ptr__->mClassId = pUVar4->mClassId;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar2;
    __return_storage_ptr__->mObjectId = OVar1;
    COLLADABU::URI::~URI(&uri);
  }
  return __return_storage_ptr__;
}

Assistant:

COLLADAFW::UniqueId IFilePartLoader::createUniqueIdFromId( const ParserChar* colladaId, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );

		if ( !colladaId || !(*colladaId) )
			return createUniqueId(classId);

		COLLADABU::URI uri(getFileUri(), String("#") + String((const char *)colladaId));

		COLLADAFW::UniqueId createdUniqueId = createUniqueIdFromUrl(uri, classId, true);
		return createdUniqueId;
	}